

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Edg_ManEvalEdgeDelay(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int in_EDX;
  int iVar6;
  int i;
  int Id;
  
  if ((p->vEdge1 != (Vec_Int_t *)0x0) && (p->vEdge2 != (Vec_Int_t *)0x0)) {
    if (p->vEdgeDelay == (Vec_Int_t *)0x0) {
      pVVar5 = Vec_IntStart(p->nObjs);
      p->vEdgeDelay = pVVar5;
    }
    else {
      Vec_IntFill(p->vEdgeDelay,p->nObjs,in_EDX);
    }
    iVar6 = 0;
    Id = 1;
    do {
      if (p->nObjs <= Id) {
        return iVar6;
      }
      iVar1 = Gia_ObjIsLut2(p,Id);
      if (iVar1 != 0) {
        pVVar5 = p->vEdgeDelay;
        iVar1 = Gia_ObjIsLut2(p,Id);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsLut2(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x2b4,"int Edg_ObjEvalEdgeDelay(Gia_Man_t *, int, Vec_Int_t *)");
        }
        i = 0;
        iVar1 = 0;
        while( true ) {
          iVar2 = Gia_ObjLutSize2(p,Id);
          if (iVar2 <= i) break;
          iVar2 = Gia_ObjLutFanin2(p,Id,i);
          iVar3 = Vec_IntEntry(pVVar5,iVar2);
          uVar4 = Gia_ObjHaveEdge(p,Id,iVar2);
          iVar3 = (uVar4 ^ 1) + iVar3;
          if (iVar1 <= iVar3) {
            iVar1 = iVar3;
          }
          i = i + 1;
        }
        Vec_IntWriteEntry(p->vEdgeDelay,Id,iVar1);
        if (iVar6 <= iVar1) {
          iVar6 = iVar1;
        }
      }
      Id = Id + 1;
    } while( true );
  }
  __assert_fail("p->vEdge1 && p->vEdge2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                ,0x2c0,"int Edg_ManEvalEdgeDelay(Gia_Man_t *)");
}

Assistant:

int Edg_ManEvalEdgeDelay( Gia_Man_t * p )
{
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelay == NULL )
        p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelay, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelay(p, iLut, p->vEdgeDelay);
        Vec_IntWriteEntry( p->vEdgeDelay, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}